

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O3

void parseMap(char *loadDir,MapList *mapList,Dialog *dialog)

{
  Map *__dest;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *__s;
  size_t sVar6;
  DIR *__dirp;
  dirent *pdVar7;
  FILE *__stream;
  long lVar8;
  char *pcVar9;
  Dialog *pDVar10;
  char *textBox [3];
  regex_t riotExt;
  char line [80];
  char path [4096];
  Dialog *local_10e8;
  char *local_10e0;
  char *local_10d8;
  regex_t local_10c8;
  char local_1088 [80];
  char local_1038 [4104];
  
  regcomp(&local_10c8,"(\\.)?[0-9](.riot)$",9);
  mapList->count = 0;
  __s = loadDir;
  if (loadDir == (char *)0x0) {
    __s = getcwd((char *)0x0,0x1000);
    sVar6 = strlen(__s);
    builtin_strncpy(__s + sVar6,"/assets",8);
  }
  __dirp = opendir(__s);
  bVar1 = true;
  if ((__dirp != (DIR *)0x0) && (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0)) {
    bVar1 = true;
    do {
      while( true ) {
        sprintf(local_1038,"%s/%s",__s);
        iVar3 = regexec(&local_10c8,pdVar7->d_name,0,(regmatch_t *)0x0,0);
        if ((iVar3 == 0) && (__stream = fopen(local_1038,"r"), __stream != (FILE *)0x0)) break;
LAB_00102568:
        pdVar7 = readdir(__dirp);
        if (pdVar7 == (dirent *)0x0) goto LAB_001027ba;
      }
      fseek(__stream,0,2);
      lVar8 = ftell(__stream);
      if (lVar8 < 0x609) goto LAB_00102568;
      rewind(__stream);
      cVar2 = pdVar7->d_name[0];
      if (cVar2 == '.') {
        cVar2 = pdVar7->d_name[1];
      }
      iVar3 = cVar2 + -0x30;
      __dest = mapList->level + iVar3;
      mapList->level[iVar3].levelNo = iVar3;
      fgets(local_1088,0x50,__stream);
      strtok(local_1088,"]");
      pcVar9 = strtok((char *)0x0,"\n");
      strcpy(__dest->name,pcVar9);
      fgets(local_1088,0x50,__stream);
      strtok(local_1088,"]");
      pcVar9 = strtok((char *)0x0,"\n");
      iVar4 = atoi(pcVar9);
      mapList->level[iVar3].repMax = iVar4;
      fgets(local_1088,0x50,__stream);
      strtok(local_1088,"]");
      pcVar9 = strtok((char *)0x0,"\n");
      iVar4 = atoi(pcVar9);
      mapList->level[iVar3].panicMax = iVar4;
      fgets(local_1088,0x50,__stream);
      strtok(local_1088,"]");
      pcVar9 = strtok((char *)0x0,"\n");
      strcpy(mapList->level[iVar3].inmates,pcVar9);
      do {
        iVar3 = fgetc(__stream);
      } while (iVar3 == 0x3e);
      lVar8 = 0;
      do {
        fgets(__dest->overlay[0] + lVar8,0x48,__stream);
        fseek(__stream,2,1);
        lVar8 = lVar8 + 0x49;
      } while (lVar8 != 0x490);
      iVar3 = __dest->levelNo;
      local_10e8 = dialog + iVar3;
      local_10e0 = dialog[iVar3].textWin;
      local_10d8 = dialog[iVar3].textLose;
      lVar8 = 0;
      do {
        do {
          uVar5 = fgetc(__stream);
        } while ((char)uVar5 == '>');
        if ((uVar5 & 0xff) == 0) {
          (&local_10e8)[lVar8]->textIntro[0] = '\0';
        }
        else {
          iVar3 = fgetc(__stream);
          if ((char)iVar3 != '>') {
            pDVar10 = (&local_10e8)[lVar8];
            do {
              pDVar10->textIntro[0] = (char)iVar3;
              iVar3 = fgetc(__stream);
              pDVar10 = (Dialog *)(pDVar10->textIntro + 1);
            } while ((char)iVar3 != '>');
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      fclose(__stream);
      mapList->count = mapList->count + 1;
      pdVar7 = readdir(__dirp);
      bVar1 = false;
    } while (pdVar7 != (dirent *)0x0);
  }
LAB_001027ba:
  closedir(__dirp);
  regfree(&local_10c8);
  if (loadDir == (char *)0x0) {
    free(__s);
  }
  if (bVar1) {
    quit("No map files found");
  }
  return;
}

Assistant:

void parseMap(char *loadDir, struct MapList *mapList, struct Dialog *dialog) {

    FILE *file;
    DIR *directory;
    regex_t riotExt;

    struct Map *current;
    struct dirent *entry;

    char path[PATH_MAX];
    char line[MAX_COLS];
    char *textBox[3];
    char checkChar;
    bool useCwd = false;
    bool firstRun = true;

    int x, y;

    /* Compile regex */
    regcomp(&riotExt, REGEX_EXT, REG_NOSUB | REG_EXTENDED);

    /* Create a new mapList to store map file details */
    mapList->count = 0;

    /* Use map directory passed as argument if provided, else cwd */
    if (!loadDir) {
        loadDir = getcwd(loadDir, PATH_MAX);
        strcat(loadDir,"/assets");
        useCwd = true;
    }

    /* Attempt to iterate through files in loadDir */
    if ((directory = opendir(loadDir)))

        while ((entry = readdir(directory))) {
            sprintf(path, "%s/%s", loadDir, entry->d_name);

            /* Skip if not readable .riot# file */
            if (regexec(&riotExt, entry->d_name, 0, NULL, 0)) continue;
            if (!(file = fopen(path, "r"))) continue;
            fseek(file, 0, SEEK_END);
            if (ftell(file) < MAP_SIZE) continue;
            rewind(file);
            /* Determine level number from filename*/
            if (entry->d_name[0] == '.') {
                current = &mapList->level[entry->d_name[1] - '0'];
                current->levelNo = entry->d_name[1] - '0';
            } else {
                current = &mapList->level[entry->d_name[0] - '0'];
                current->levelNo = entry->d_name[0] - '0';
            }

            /* Get level name */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->name, strtok(NULL, "\n"));

            /* Get rep */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->repMax = atoi(strtok(NULL, "\n"));

            /* Get panic */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->panicMax = atoi(strtok(NULL, "\n"));

            /* Get units */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->inmates, strtok(NULL, "\n"));

            /* Get map */
            while ((fgetc(file) == '>'));
            for (y = 0; y < MAP_ROWS; y++) {
                fgets(current->overlay[y], MAP_COLS, file);
                fseek(file, 2, SEEK_CUR);
            }

            /* Get text boxes*/
            textBox[0] = dialog[current->levelNo].textIntro;
            textBox[1] = dialog[current->levelNo].textWin;
            textBox[2] = dialog[current->levelNo].textLose;

            for (int i = 0; i < 3; i++) {
                x = 0;
                do checkChar = fgetc(file); while (checkChar == '>');
                if (checkChar == '\0') strcpy(textBox[i], "");
                else
                    while ((checkChar = fgetc(file)) != '>') {
                        textBox[i][x++] = checkChar;
                    }
            }

            fclose(file);
            mapList->count++;
            firstRun = false;
        }

    /* Clean up memory */
    closedir(directory);
    regfree(&riotExt);
    if (useCwd) free(loadDir); //getcwd calls malloc, if used must free loadDir

    /* Terminate if no map files where found */
    if (firstRun) {
        quit("No map files found");
    }

    return;
}